

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O3

void duckdb_je_arena_reset(tsd_t *tsd,arena_t *arena)

{
  uint64_t *puVar1;
  witness_t **ppwVar2;
  ulong *puVar3;
  bin_t *bin;
  undefined8 *puVar4;
  undefined8 *puVar5;
  void *pvVar6;
  rtree_leaf_elm_t *prVar7;
  ulong uVar8;
  undefined8 uVar9;
  int iVar10;
  edata_t *peVar11;
  ulong uVar12;
  rtree_ctx_t *rtree_ctx;
  ulong uVar13;
  long lVar14;
  mutex_prof_data_t *data_2;
  pthread_mutex_t *ppVar15;
  mutex_prof_data_t *data;
  rtree_ctx_t local_1b0;
  
  ppVar15 = (pthread_mutex_t *)((long)&(arena->large_mtx).field_0 + 0x48);
  iVar10 = pthread_mutex_trylock(ppVar15);
  if (iVar10 != 0) {
    duckdb_je_malloc_mutex_lock_slow(&arena->large_mtx);
    (arena->large_mtx).field_0.field_0.locked.repr = true;
  }
  puVar1 = &(arena->large_mtx).field_0.field_0.prof_data.n_lock_ops;
  *puVar1 = *puVar1 + 1;
  if (&((arena->large_mtx).field_0.field_0.prof_data.prev_owner)->tsd != tsd) {
    (arena->large_mtx).field_0.field_0.prof_data.prev_owner = (tsdn_t *)tsd;
    ppwVar2 = &(arena->large_mtx).field_0.witness.link.qre_prev;
    *ppwVar2 = (witness_t *)((long)&(*ppwVar2)->name + 1);
  }
  peVar11 = (arena->large).head.qlh_first;
  if (peVar11 != (edata_t *)0x0) {
    do {
      pvVar6 = peVar11->e_addr;
      (arena->large_mtx).field_0.field_0.locked.repr = false;
      pthread_mutex_unlock(ppVar15);
      rtree_ctx = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
      if (tsd == (tsd_t *)0x0) {
        duckdb_je_rtree_ctx_data_init(&local_1b0);
        rtree_ctx = &local_1b0;
      }
      uVar12 = (ulong)pvVar6 & 0xffffffffc0000000;
      uVar13 = (ulong)(((uint)((ulong)pvVar6 >> 0x1e) & 0xf) << 4);
      puVar3 = (ulong *)((long)&rtree_ctx->cache[0].leafkey + uVar13);
      uVar13 = *(ulong *)((long)&rtree_ctx->cache[0].leafkey + uVar13);
      if (uVar13 != uVar12) {
        if (rtree_ctx->l2_cache[0].leafkey == uVar12) {
          prVar7 = rtree_ctx->l2_cache[0].leaf;
          rtree_ctx->l2_cache[0].leafkey = uVar13;
          rtree_ctx->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar3[1];
          *puVar3 = uVar12;
          puVar3[1] = (ulong)prVar7;
        }
        else {
          lVar14 = 0x118;
          do {
            if (*(ulong *)((long)rtree_ctx->cache + lVar14 + -8) == uVar12) {
              uVar8 = *(ulong *)((long)&rtree_ctx->cache[0].leafkey + lVar14);
              puVar4 = (undefined8 *)((long)rtree_ctx->cache + lVar14 + -0x18);
              uVar9 = puVar4[1];
              puVar5 = (undefined8 *)((long)rtree_ctx->cache + lVar14 + -8);
              *puVar5 = *puVar4;
              puVar5[1] = uVar9;
              *(ulong *)((long)rtree_ctx->cache + lVar14 + -0x18) = uVar13;
              *(ulong *)((long)(rtree_ctx->cache + -1) + lVar14) = puVar3[1];
              *puVar3 = uVar12;
              puVar3[1] = uVar8;
              goto LAB_01d59534;
            }
            lVar14 = lVar14 + 0x10;
          } while (lVar14 != 0x188);
          duckdb_je_rtree_leaf_elm_lookup_hard
                    ((tsdn_t *)tsd,&duckdb_je_arena_emap_global.rtree,rtree_ctx,
                     (ulong)pvVar6 & 0xfffffffffffff000,true,false);
        }
      }
LAB_01d59534:
      duckdb_je_large_dalloc((tsdn_t *)tsd,peVar11);
      iVar10 = pthread_mutex_trylock(ppVar15);
      if (iVar10 != 0) {
        duckdb_je_malloc_mutex_lock_slow(&arena->large_mtx);
        (arena->large_mtx).field_0.field_0.locked.repr = true;
      }
      puVar1 = &(arena->large_mtx).field_0.field_0.prof_data.n_lock_ops;
      *puVar1 = *puVar1 + 1;
      if (&((arena->large_mtx).field_0.field_0.prof_data.prev_owner)->tsd != tsd) {
        (arena->large_mtx).field_0.field_0.prof_data.prev_owner = (tsdn_t *)tsd;
        ppwVar2 = &(arena->large_mtx).field_0.witness.link.qre_prev;
        *ppwVar2 = (witness_t *)((long)&(*ppwVar2)->name + 1);
      }
      peVar11 = (arena->large).head.qlh_first;
    } while (peVar11 != (edata_t *)0x0);
  }
  (arena->large_mtx).field_0.field_0.locked.repr = false;
  pthread_mutex_unlock(ppVar15);
  uVar13 = 0;
  do {
    if (duckdb_je_bin_infos[uVar13].n_shards != 0) {
      uVar12 = 0;
      do {
        lVar14 = uVar12 << 8;
        if (uVar13 < duckdb_je_bin_info_nbatched_sizes) {
          lVar14 = uVar12 * 0x288;
        }
        bin = (bin_t *)((long)&arena->nthreads[0].repr +
                       lVar14 + (ulong)duckdb_je_arena_bin_offsets[uVar13]);
        ppVar15 = (pthread_mutex_t *)
                  ((long)&((atomic_zu_t *)(arena->nthreads + 0x12))->repr +
                  lVar14 + (ulong)duckdb_je_arena_bin_offsets[uVar13]);
        iVar10 = pthread_mutex_trylock(ppVar15);
        if (iVar10 != 0) {
          duckdb_je_malloc_mutex_lock_slow((malloc_mutex_t *)bin);
          (bin->lock).field_0.field_0.locked.repr = true;
        }
        puVar1 = &(bin->lock).field_0.field_0.prof_data.n_lock_ops;
        *puVar1 = *puVar1 + 1;
        if (&((bin->lock).field_0.field_0.prof_data.prev_owner)->tsd != tsd) {
          (bin->lock).field_0.field_0.prof_data.prev_owner = (tsdn_t *)tsd;
          ppwVar2 = &(bin->lock).field_0.witness.link.qre_prev;
          *ppwVar2 = (witness_t *)((long)&(*ppwVar2)->name + 1);
        }
        if (uVar13 < duckdb_je_bin_info_nbatched_sizes) {
          batcher_init((batcher_t *)(bin + 1),0x10);
        }
        peVar11 = bin->slabcur;
        if (peVar11 != (edata_t *)0x0) {
          bin->slabcur = (edata_t *)0x0;
          (bin->lock).field_0.field_0.locked.repr = false;
          pthread_mutex_unlock(ppVar15);
          duckdb_je_arena_slab_dalloc((tsdn_t *)tsd,arena,peVar11);
          iVar10 = pthread_mutex_trylock(ppVar15);
          if (iVar10 != 0) {
            duckdb_je_malloc_mutex_lock_slow((malloc_mutex_t *)bin);
            (bin->lock).field_0.field_0.locked.repr = true;
          }
          puVar1 = &(bin->lock).field_0.field_0.prof_data.n_lock_ops;
          *puVar1 = *puVar1 + 1;
          if (&((bin->lock).field_0.field_0.prof_data.prev_owner)->tsd != tsd) {
            (bin->lock).field_0.field_0.prof_data.prev_owner = (tsdn_t *)tsd;
            ppwVar2 = &(bin->lock).field_0.witness.link.qre_prev;
            *ppwVar2 = (witness_t *)((long)&(*ppwVar2)->name + 1);
          }
        }
        peVar11 = duckdb_je_edata_heap_remove_first(&bin->slabs_nonfull);
        while (peVar11 != (edata_t *)0x0) {
          (bin->lock).field_0.field_0.locked.repr = false;
          pthread_mutex_unlock(ppVar15);
          duckdb_je_arena_slab_dalloc((tsdn_t *)tsd,arena,peVar11);
          iVar10 = pthread_mutex_trylock(ppVar15);
          if (iVar10 != 0) {
            duckdb_je_malloc_mutex_lock_slow((malloc_mutex_t *)bin);
            (bin->lock).field_0.field_0.locked.repr = true;
          }
          puVar1 = &(bin->lock).field_0.field_0.prof_data.n_lock_ops;
          *puVar1 = *puVar1 + 1;
          if (&((bin->lock).field_0.field_0.prof_data.prev_owner)->tsd != tsd) {
            (bin->lock).field_0.field_0.prof_data.prev_owner = (tsdn_t *)tsd;
            ppwVar2 = &(bin->lock).field_0.witness.link.qre_prev;
            *ppwVar2 = (witness_t *)((long)&(*ppwVar2)->name + 1);
          }
          peVar11 = duckdb_je_edata_heap_remove_first(&bin->slabs_nonfull);
        }
        peVar11 = (bin->slabs_full).head.qlh_first;
        while (peVar11 != (edata_t *)0x0) {
          arena_bin_slabs_full_remove((arena_t *)(ulong)arena->ind,bin,peVar11);
          (bin->lock).field_0.field_0.locked.repr = false;
          pthread_mutex_unlock(ppVar15);
          duckdb_je_arena_slab_dalloc((tsdn_t *)tsd,arena,peVar11);
          iVar10 = pthread_mutex_trylock(ppVar15);
          if (iVar10 != 0) {
            duckdb_je_malloc_mutex_lock_slow((malloc_mutex_t *)bin);
            (bin->lock).field_0.field_0.locked.repr = true;
          }
          puVar1 = &(bin->lock).field_0.field_0.prof_data.n_lock_ops;
          *puVar1 = *puVar1 + 1;
          if (&((bin->lock).field_0.field_0.prof_data.prev_owner)->tsd != tsd) {
            (bin->lock).field_0.field_0.prof_data.prev_owner = (tsdn_t *)tsd;
            ppwVar2 = &(bin->lock).field_0.witness.link.qre_prev;
            *ppwVar2 = (witness_t *)((long)&(*ppwVar2)->name + 1);
          }
          peVar11 = (bin->slabs_full).head.qlh_first;
        }
        (bin->stats).curregs = 0;
        (bin->stats).curslabs = 0;
        (bin->lock).field_0.field_0.locked.repr = false;
        pthread_mutex_unlock(ppVar15);
        uVar12 = uVar12 + 1;
      } while (uVar12 < duckdb_je_bin_infos[uVar13].n_shards);
    }
    uVar13 = uVar13 + 1;
  } while (uVar13 != 0x24);
  duckdb_je_pa_shard_reset((tsdn_t *)tsd,&arena->pa_shard);
  return;
}

Assistant:

void
arena_reset(tsd_t *tsd, arena_t *arena) {
	/*
	 * Locking in this function is unintuitive.  The caller guarantees that
	 * no concurrent operations are happening in this arena, but there are
	 * still reasons that some locking is necessary:
	 *
	 * - Some of the functions in the transitive closure of calls assume
	 *   appropriate locks are held, and in some cases these locks are
	 *   temporarily dropped to avoid lock order reversal or deadlock due to
	 *   reentry.
	 * - mallctl("epoch", ...) may concurrently refresh stats.  While
	 *   strictly speaking this is a "concurrent operation", disallowing
	 *   stats refreshes would impose an inconvenient burden.
	 */

	/* Large allocations. */
	malloc_mutex_lock(tsd_tsdn(tsd), &arena->large_mtx);

	for (edata_t *edata = edata_list_active_first(&arena->large);
	    edata != NULL; edata = edata_list_active_first(&arena->large)) {
		void *ptr = edata_base_get(edata);
		size_t usize;

		malloc_mutex_unlock(tsd_tsdn(tsd), &arena->large_mtx);
		emap_alloc_ctx_t alloc_ctx;
		emap_alloc_ctx_lookup(tsd_tsdn(tsd), &arena_emap_global, ptr,
		    &alloc_ctx);
		assert(alloc_ctx.szind != SC_NSIZES);

		if (config_stats || (config_prof && opt_prof)) {
			usize = sz_index2size(alloc_ctx.szind);
			assert(usize == isalloc(tsd_tsdn(tsd), ptr));
		}
		/* Remove large allocation from prof sample set. */
		if (config_prof && opt_prof) {
			prof_free(tsd, ptr, usize, &alloc_ctx);
		}
		if (config_prof && opt_prof && alloc_ctx.szind < SC_NBINS) {
			arena_dalloc_promoted_impl(tsd_tsdn(tsd), ptr,
			    /* tcache */ NULL, /* slow_path */ true, edata);
		} else {
			large_dalloc(tsd_tsdn(tsd), edata);
		}
		malloc_mutex_lock(tsd_tsdn(tsd), &arena->large_mtx);
	}
	malloc_mutex_unlock(tsd_tsdn(tsd), &arena->large_mtx);

	/* Bins. */
	for (unsigned i = 0; i < SC_NBINS; i++) {
		for (unsigned j = 0; j < bin_infos[i].n_shards; j++) {
			arena_bin_reset(tsd, arena, arena_get_bin(arena, i, j),
			    i);
		}
	}
	pa_shard_reset(tsd_tsdn(tsd), &arena->pa_shard);
}